

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::Marray<int,false,std::allocator<unsigned_long>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          View<int,_false,_std::allocator<unsigned_long>_> *in)

{
  size_type __n;
  bool bVar1;
  size_t sVar2;
  size_t *psVar3;
  int *piVar4;
  reference piVar5;
  size_t j;
  ulong uVar6;
  size_t j_1;
  const_iterator it;
  const_iterator local_60;
  
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,(allocator_type *)&local_60);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant(in);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::operator=
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),&in->geometry_);
  uVar6 = 0;
  while( true ) {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(in);
    if (sVar2 <= uVar6) break;
    sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                      (&in->geometry_,uVar6);
    psVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides
                       ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),uVar6);
    *psVar3 = sVar2;
    uVar6 = uVar6 + 1;
  }
  this[0x3c] = (Marray<int,std::allocator<unsigned_long>>)0x1;
  __n = (in->geometry_).size_;
  if (__n == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  }
  *(int **)this = piVar4;
  bVar1 = View<int,_false,_std::allocator<unsigned_long>_>::isSimple(in);
  if (bVar1) {
    memcpy(*(void **)this,in->data_,(in->geometry_).size_ << 2);
  }
  else {
    View<int,_false,_std::allocator<unsigned_long>_>::begin(&local_60,in);
    for (uVar6 = 0; uVar6 < *(ulong *)(this + 0x30); uVar6 = uVar6 + 1) {
      piVar5 = Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(&local_60);
      *(int *)(*(long *)this + uVar6 * 4) = *piVar5;
      Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++(&local_60);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_60.coordinates_.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const View<TLocal, isConstLocal, ALocal>& in
) 
: dataAllocator_()
{
    if(!MARRAY_NO_ARG_TEST) {
        in.testInvariant();
    }

    // adapt geometry
    this->geometry_ = in.geometry_;
    for(std::size_t j=0; j<in.dimension(); ++j) {
        this->geometry_.strides(j) = in.geometry_.shapeStrides(j); // !
    }
    this->geometry_.isSimple() = true;

    // copy data
    if(in.size() == 0) {
        this->data_ = 0;
    }
    else {
        this->data_ = dataAllocator_.allocate(in.size());
    }
    if(in.isSimple() && marray_detail::IsEqual<T, TLocal>::type) {
        memcpy(this->data_, in.data_, (in.size())*sizeof(T));
    }
    else {
        typename View<TLocal, isConstLocal, ALocal>::const_iterator it = in.begin();
        for(std::size_t j=0; j<this->size(); ++j, ++it)  {
            this->data_[j] = static_cast<T>(*it);
        }
    }

    testInvariant();
}